

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
Chainstate::InitCoinsDB
          (Chainstate *this,size_t cache_size_bytes,bool in_memory,bool should_wipe,
          path leveldb_name)

{
  ChainstateManager *pCVar1;
  CoinsViews *__ptr_00;
  DBParams db_params;
  CoinsViews *this_00;
  pointer *__ptr;
  path *in_R8;
  long in_FS_OFFSET;
  CoinsViewOptions options;
  _Alloc_hider in_stack_ffffffffffffff28;
  CoinsViews *__ptr_01;
  undefined1 in_stack_ffffffffffffff30 [48];
  undefined4 local_78;
  path local_70;
  size_t local_48;
  undefined4 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == true) {
    std::filesystem::__cxx11::path::_M_concat();
  }
  std::filesystem::__cxx11::path::path
            ((path *)&stack0xffffffffffffff30,&(this->m_chainman->m_options).datadir.super_path);
  std::filesystem::__cxx11::path::operator/=((path *)&stack0xffffffffffffff30,in_R8);
  std::filesystem::__cxx11::path::path
            ((path *)&stack0xffffffffffffff58,(path *)&stack0xffffffffffffff30);
  pCVar1 = this->m_chainman;
  local_78 = CONCAT13((pCVar1->m_options).coins_db.force_compact,
                      CONCAT12(1,CONCAT11(should_wipe,in_memory)));
  this_00 = (CoinsViews *)operator_new(0x88);
  std::filesystem::__cxx11::path::path(&local_70,(path *)&stack0xffffffffffffff58);
  local_40 = local_78;
  db_params.path.super_path._M_pathname._M_string_length = in_stack_ffffffffffffff30._0_8_;
  db_params.path.super_path._M_pathname.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff30._8_16_;
  db_params.path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_ffffffffffffff30._24_8_;
  db_params.cache_bytes = in_stack_ffffffffffffff30._32_8_;
  db_params.memory_only = (bool)in_stack_ffffffffffffff30[0x28];
  db_params.wipe_data = (bool)in_stack_ffffffffffffff30[0x29];
  db_params.obfuscate = (bool)in_stack_ffffffffffffff30[0x2a];
  db_params.options.force_compact = (bool)in_stack_ffffffffffffff30[0x2b];
  db_params._52_4_ = in_stack_ffffffffffffff30._44_4_;
  db_params.path.super_path._M_pathname._M_dataplus._M_p = in_stack_ffffffffffffff28._M_p;
  options._8_8_ = (pCVar1->m_options).coins_view.batch_write_bytes;
  options.batch_write_bytes = (size_t)&local_70;
  local_48 = cache_size_bytes;
  CoinsViews::CoinsViews(this_00,db_params,options);
  std::filesystem::__cxx11::path::~path(&local_70);
  __ptr_01 = (CoinsViews *)0x0;
  __ptr_00 = (this->m_coins_views)._M_t.
             super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
             super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
             super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
  (this->m_coins_views)._M_t.super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
  _M_t.super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
  super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl = this_00;
  if (__ptr_00 != (CoinsViews *)0x0) {
    std::default_delete<CoinsViews>::operator()
              ((default_delete<CoinsViews> *)&this->m_coins_views,__ptr_00);
  }
  if (__ptr_01 != (CoinsViews *)0x0) {
    std::default_delete<CoinsViews>::operator()
              ((default_delete<CoinsViews> *)&stack0xffffffffffffff28,__ptr_01);
  }
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff58);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::InitCoinsDB(
    size_t cache_size_bytes,
    bool in_memory,
    bool should_wipe,
    fs::path leveldb_name)
{
    if (m_from_snapshot_blockhash) {
        leveldb_name += node::SNAPSHOT_CHAINSTATE_SUFFIX;
    }

    m_coins_views = std::make_unique<CoinsViews>(
        DBParams{
            .path = m_chainman.m_options.datadir / leveldb_name,
            .cache_bytes = cache_size_bytes,
            .memory_only = in_memory,
            .wipe_data = should_wipe,
            .obfuscate = true,
            .options = m_chainman.m_options.coins_db},
        m_chainman.m_options.coins_view);
}